

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

void __thiscall crnlib::dxt_image::clear(dxt_image *this)

{
  element *p;
  
  p = (this->m_elements).m_p;
  if (p != (element *)0x0) {
    crnlib_free(p);
    (this->m_elements).m_p = (element *)0x0;
    (this->m_elements).m_size = 0;
    (this->m_elements).m_capacity = 0;
  }
  this->m_width = 0;
  this->m_height = 0;
  this->m_blocks_x = 0;
  this->m_blocks_y = 0;
  this->m_format = cDXTInvalid;
  this->m_element_type[0] = cUnused;
  this->m_element_type[1] = cUnused;
  this->m_element_component_index[0] = '\0';
  this->m_element_component_index[1] = '\0';
  this->m_total_blocks = 0;
  this->m_total_elements = 0;
  this->m_num_elements_per_block = 0;
  this->m_bytes_per_block = 0;
  this->m_pElements = (element *)0x0;
  return;
}

Assistant:

void dxt_image::clear()
    {
        m_elements.clear();
        m_width = 0;
        m_height = 0;
        m_blocks_x = 0;
        m_blocks_y = 0;
        m_num_elements_per_block = 0;
        m_bytes_per_block = 0;
        m_format = cDXTInvalid;
        utils::zero_object(m_element_type);
        utils::zero_object(m_element_component_index);
        m_total_blocks = 0;
        m_total_elements = 0;
        m_pElements = nullptr;
    }